

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphcycles.cc
# Opt level: O0

pair<std::vector<int,_std::allocator<int>_>,_bool> * __thiscall
xla::GraphCycles::PathDagIDs
          (pair<std::vector<int,_std::allocator<int>_>,_bool> *__return_storage_ptr__,
          GraphCycles *this,int x,int y,int max_path_len)

{
  int iVar1;
  int *path_00;
  reference __x;
  int local_58;
  bool local_51;
  int i;
  bool overflow;
  int np;
  undefined1 local_40 [8];
  vector<int,_std::allocator<int>_> path;
  int max_path_len_local;
  int y_local;
  int x_local;
  GraphCycles *this_local;
  
  path.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = max_path_len;
  if ((PathDagIDs(int,int,int)::kPathSize == '\0') &&
     (iVar1 = __cxa_guard_acquire(&PathDagIDs(int,int,int)::kPathSize), iVar1 != 0)) {
    PathDagIDs::kPathSize =
         path.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_end_of_storage._4_4_;
    __cxa_guard_release(&PathDagIDs(int,int,int)::kPathSize);
  }
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)local_40);
  std::vector<int,_std::allocator<int>_>::reserve
            ((vector<int,_std::allocator<int>_> *)local_40,(long)PathDagIDs::kPathSize);
  iVar1 = PathDagIDs::kPathSize;
  path_00 = std::vector<int,_std::allocator<int>_>::data
                      ((vector<int,_std::allocator<int>_> *)local_40);
  i = FindPath(this,x,y,iVar1,path_00);
  local_51 = path.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage._4_4_ < i;
  for (local_58 = 0; (local_58 < i && (local_58 < PathDagIDs::kPathSize)); local_58 = local_58 + 1)
  {
    __x = std::vector<int,_std::allocator<int>_>::operator[]
                    ((vector<int,_std::allocator<int>_> *)local_40,(long)local_58);
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)local_40,__x);
  }
  std::pair<std::vector<int,_std::allocator<int>_>,_bool>::
  pair<std::vector<int,_std::allocator<int>_>_&,_bool_&,_true>
            (__return_storage_ptr__,(vector<int,_std::allocator<int>_> *)local_40,&local_51);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_40);
  return __return_storage_ptr__;
}

Assistant:

std::pair<std::vector<int32_t>, bool> GraphCycles::PathDagIDs(int x, int y, const int max_path_len) {
  static const int kPathSize = max_path_len;
  std::vector<int32_t> path;
  path.reserve(kPathSize);
  
  int np = FindPath(x, y, kPathSize, path.data());
  bool overflow = np > max_path_len;
  
  for (int i = 0; i < np; i++) {
      if (i >= kPathSize) {
          break;
      } 
      path.push_back(path[i]);
  }

  return std::pair<std::vector<int32_t>, bool>(path, overflow);
}